

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_source_mgr *pjVar3;
  bool bVar4;
  boolean bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint unaff_EBP;
  uint uVar10;
  _func_void_j_decompress_ptr *get_buffer;
  uint nbits;
  int iVar11;
  int bits_left;
  bitread_working_state br_state;
  bitread_working_state local_70;
  d_derived_tbl *local_48;
  JBLOCKROW local_40;
  int *local_38;
  
  pjVar2 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar5 = process_restart(cinfo), bVar5 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      if (*(int *)&pjVar2[2].start_pass == 0) {
        iVar8 = cinfo->Se;
        iVar1 = cinfo->Al;
        local_38 = cinfo->natural_order;
        local_70.next_input_byte = cinfo->src->next_input_byte;
        local_70.bytes_in_buffer = cinfo->src->bytes_in_buffer;
        get_buffer = pjVar2[1].start_pass;
        bits_left = *(int *)&pjVar2[1].decode_mcu;
        iVar9 = cinfo->Ss;
        if (iVar8 < iVar9) {
          iVar8 = 0;
        }
        else {
          local_40 = *MCU_data;
          local_48 = (d_derived_tbl *)pjVar2[6].start_pass;
          local_70.cinfo = cinfo;
          do {
            if (bits_left < 8) {
              bVar5 = jpeg_fill_bit_buffer(&local_70,(bit_buf_type)get_buffer,bits_left,0);
              if (bVar5 != 0) {
                iVar11 = 1;
                get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer;
                bits_left = local_70.bits_left;
                if (7 < local_70.bits_left) goto LAB_00284c3d;
                goto LAB_00284c6f;
              }
LAB_00284c9f:
              bVar4 = false;
            }
            else {
LAB_00284c3d:
              uVar7 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
              if (local_48->look_nbits[uVar7] == 0) {
                iVar11 = 9;
LAB_00284c6f:
                unaff_EBP = jpeg_huff_decode(&local_70,(bit_buf_type)get_buffer,bits_left,local_48,
                                             iVar11);
                if ((int)unaff_EBP < 0) {
                  unaff_EBP = 0xffffffff;
                  goto LAB_00284c9f;
                }
                bVar4 = true;
                get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer;
                bits_left = local_70.bits_left;
              }
              else {
                bits_left = bits_left - local_48->look_nbits[uVar7];
                unaff_EBP = (uint)local_48->look_sym[uVar7];
                bVar4 = true;
              }
            }
            if (!bVar4) {
              return 0;
            }
            iVar11 = (int)unaff_EBP >> 4;
            nbits = unaff_EBP & 0xf;
            if (nbits == 0) {
              if (iVar11 != 0xf) {
                iVar8 = 1 << ((byte)iVar11 & 0x1f);
                if (0xf < unaff_EBP) {
                  if ((bits_left < iVar11) &&
                     (bVar5 = jpeg_fill_bit_buffer
                                        (&local_70,(bit_buf_type)get_buffer,bits_left,iVar11),
                     get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer,
                     bits_left = local_70.bits_left, bVar5 == 0)) {
                    return 0;
                  }
                  bits_left = bits_left - iVar11;
                  iVar8 = ((uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[iVar11]) +
                          iVar8;
                }
                iVar8 = iVar8 + -1;
                goto LAB_00284dc2;
              }
              iVar11 = iVar9 + 0xf;
              unaff_EBP = 0;
            }
            else {
              if ((bits_left < (int)nbits) &&
                 (bVar5 = jpeg_fill_bit_buffer(&local_70,(bit_buf_type)get_buffer,bits_left,nbits),
                 get_buffer = (_func_void_j_decompress_ptr *)local_70.get_buffer,
                 bits_left = local_70.bits_left, bVar5 == 0)) {
                return 0;
              }
              bits_left = bits_left - nbits;
              iVar11 = iVar11 + iVar9;
              uVar6 = bmask[nbits];
              uVar10 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & uVar6;
              if (bmask[nbits - 1] < (int)uVar10) {
                uVar6 = 0;
              }
              unaff_EBP = uVar10 - uVar6;
              (*local_40)[local_38[iVar11]] = (JCOEF)(unaff_EBP << ((byte)iVar1 & 0x1f));
            }
            iVar9 = iVar11 + 1;
          } while (iVar11 < iVar8);
          iVar8 = 0;
        }
LAB_00284dc2:
        pjVar3 = cinfo->src;
        pjVar3->next_input_byte = local_70.next_input_byte;
        pjVar3->bytes_in_buffer = local_70.bytes_in_buffer;
        pjVar2[1].start_pass = get_buffer;
        *(int *)&pjVar2[1].decode_mcu = bits_left;
      }
      else {
        iVar8 = *(int *)&pjVar2[2].start_pass + -1;
      }
      *(int *)&pjVar2[2].start_pass = iVar8;
    }
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
    bVar5 = 1;
  }
  else {
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    Al = cinfo->Al;
    natural_order = cinfo->natural_order;

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;	/* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)		/* if it's a band of zeroes... */
      EOBRUN--;			/* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
	r = s >> 4;
	s &= 15;
	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	  /* Scale and output coefficient in natural (dezigzagged) order */
	  (*block)[natural_order[k]] = (JCOEF) (s << Al);
	} else {
	  if (r == 15) {	/* ZRL */
	    k += 15;		/* skip 15 zeroes in band */
	  } else {		/* EOBr, run length is 2^r + appended bits */
	    EOBRUN = 1 << r;
	    if (r) {		/* EOBr, r > 0 */
	      CHECK_BIT_BUFFER(br_state, r, return FALSE);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    EOBRUN--;		/* this band is processed at this moment */
	    break;		/* force end-of-band */
	  }
	}
      }

      BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;	/* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}